

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_fma_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar21 [64];
  undefined1 auVar20 [32];
  
  iVar10 = a->h * a->w * a->d * a->elempack;
  uVar13 = 0;
  uVar11 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar11 = uVar13;
  }
  for (; uVar13 != uVar11; uVar13 = uVar13 + 1) {
    lVar14 = b->elemsize * b->cstep * uVar13;
    pvVar4 = b->data;
    lVar16 = c->elemsize * c->cstep * uVar13;
    pvVar5 = c->data;
    lVar15 = a->elemsize * a->cstep * uVar13;
    pvVar6 = a->data;
    lVar12 = 0;
    lVar17 = 0;
    for (iVar18 = 0; iVar18 + 7 < iVar10; iVar18 = iVar18 + 8) {
      auVar2 = *(undefined1 (*) [32])((long)pvVar4 + lVar17 + lVar14);
      auVar8 = vrcpps_avx(auVar2);
      auVar3 = *(undefined1 (*) [32])((long)pvVar6 + lVar17 + lVar15);
      auVar21._0_4_ = auVar3._0_4_ * auVar8._0_4_;
      auVar21._4_4_ = auVar3._4_4_ * auVar8._4_4_;
      auVar21._8_4_ = auVar3._8_4_ * auVar8._8_4_;
      auVar21._12_4_ = auVar3._12_4_ * auVar8._12_4_;
      auVar21._16_4_ = auVar3._16_4_ * auVar8._16_4_;
      auVar21._20_4_ = auVar3._20_4_ * auVar8._20_4_;
      auVar21._28_36_ = in_ZMM3._28_36_;
      auVar21._24_4_ = auVar3._24_4_ * auVar8._24_4_;
      auVar20 = auVar21._0_32_;
      in_ZMM3 = ZEXT3264(auVar20);
      auVar9 = vfmsub213ps_fma(auVar2,auVar20,auVar3);
      auVar9 = vfnmadd213ps_fma(ZEXT1632(auVar9),auVar8,auVar20);
      *(undefined1 (*) [32])((long)pvVar5 + lVar17 + lVar16) = ZEXT1632(auVar9);
      lVar17 = lVar17 + 0x20;
      lVar12 = lVar12 + 8;
    }
    for (; iVar18 + 3 < iVar10; iVar18 = iVar18 + 4) {
      auVar9 = *(undefined1 (*) [16])((long)pvVar6 + lVar17 + lVar15);
      auVar1 = *(undefined1 (*) [16])((long)pvVar4 + lVar17 + lVar14);
      auVar7 = vrcpps_avx(auVar1);
      auVar19._0_4_ = auVar9._0_4_ * auVar7._0_4_;
      auVar19._4_4_ = auVar9._4_4_ * auVar7._4_4_;
      auVar19._8_4_ = auVar9._8_4_ * auVar7._8_4_;
      auVar19._12_4_ = auVar9._12_4_ * auVar7._12_4_;
      in_ZMM3 = ZEXT1664(auVar19);
      auVar9 = vfmsub213ps_fma(auVar1,auVar19,auVar9);
      auVar9 = vfnmadd213ps_fma(auVar9,auVar7,auVar19);
      *(undefined1 (*) [16])((long)pvVar5 + lVar17 + lVar16) = auVar9;
      lVar17 = lVar17 + 0x10;
      lVar12 = lVar12 + 4;
    }
    for (; (int)lVar12 < iVar10; lVar12 = lVar12 + 1) {
      *(float *)((long)pvVar5 + lVar12 * 4 + lVar16) =
           *(float *)((long)pvVar6 + lVar12 * 4 + lVar15) /
           *(float *)((long)pvVar4 + lVar12 * 4 + lVar14);
    }
  }
  return iVar10;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}